

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O3

int Shr_ManDivPushOrderByLevel(Shr_Man_t *p,int iDiv)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  uint uVar6;
  uint uVar7;
  
  Vec_IntPush(p->vPrio,iDiv);
  uVar7 = p->vPrio->nSize;
  iVar4 = 0;
  if (uVar7 != 1) {
    if ((int)uVar7 < 2) {
      iVar4 = uVar7 - 1;
    }
    else {
      piVar2 = p->vPrio->pArray;
      uVar5 = extraout_RDX;
      do {
        iVar4 = piVar2[(ulong)uVar7 - 2];
        if (((long)iVar4 < 0) || (p->pNew->nObjs <= iVar4)) {
LAB_0071b4d8:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pVVar3 = p->pNew->vLevels;
        Vec_IntFillExtra(pVVar3,iVar4 + 1,(int)uVar5);
        if (pVVar3->nSize <= iVar4) {
LAB_0071b4f7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = uVar7 - 1;
        iVar1 = piVar2[uVar6];
        if (((long)iVar1 < 0) || (p->pNew->nObjs <= iVar1)) goto LAB_0071b4d8;
        iVar4 = pVVar3->pArray[iVar4];
        pVVar3 = p->pNew->vLevels;
        Vec_IntFillExtra(pVVar3,iVar1 + 1,Fill);
        if (pVVar3->nSize <= iVar1) goto LAB_0071b4f7;
        if (iVar4 <= pVVar3->pArray[iVar1]) {
          return uVar7 - 1;
        }
        iVar4 = piVar2[(ulong)uVar7 - 2];
        piVar2[(ulong)uVar7 - 2] = piVar2[uVar6];
        piVar2[uVar6] = iVar4;
        uVar7 = uVar7 - 1;
        uVar5 = extraout_RDX_00;
      } while (1 < (int)uVar7);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static inline int Shr_ManDivPushOrderByLevel( Shr_Man_t * p, int iDiv )
{
    int iPlace, * pArray;
    Vec_IntPush( p->vPrio, iDiv );
    if ( Vec_IntSize(p->vPrio) == 1 )
        return 0; 
    pArray = Vec_IntArray(p->vPrio);
    for ( iPlace = Vec_IntSize(p->vPrio) - 1; iPlace > 0; iPlace-- )
        if ( Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, pArray[iPlace-1])) > 
             Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, pArray[iPlace])) )
             ABC_SWAP( int, pArray[iPlace-1], pArray[iPlace] )
        else
            break;
    return iPlace; // the place of the new divisor
}